

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O3

int __thiscall
llbuild::commands::executeNinjaCommand
          (commands *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  size_t sVar5;
  bool bVar6;
  char cVar7;
  long *plVar8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  StringRef str;
  StringRef filename;
  StringRef buffer;
  long *plStack_f0;
  byte bStack_e8;
  Token TStack_e0;
  string sStack_c8;
  Lexer LStack_a0;
  commands *pcStack_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  cVar7 = (char)args;
  this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48;
  plVar8 = *(long **)this;
  if (plVar8 == *(long **)(this + 8)) {
LAB_0011f08c:
    executeNinjaCommand();
    sVar5 = plVar8[1] - *plVar8;
    pcStack_78 = this;
    if (sVar5 != 0x20) {
      executeLexCommand();
      return 1;
    }
    filename.Length = *(size_t *)*plVar8;
    filename.Data = (char *)&plStack_f0;
    util::readFileContents(filename);
    __stream = _stderr;
    if ((bStack_e8 & 1) == 0) {
      if (cVar7 == '\0') {
        pcVar2 = getProgramName();
        sVar5 = *(size_t *)*plVar8;
        fprintf(__stream,"note: %s: reading tokens from %s\n",pcVar2);
      }
      if ((bStack_e8 & 1) == 0) {
        buffer.Length = plStack_f0[2] - plStack_f0[1];
        buffer.Data = (char *)plStack_f0[1];
        ninja::Lexer::Lexer(&LStack_a0,buffer);
        do {
          ninja::Lexer::lex(&LStack_a0,&TStack_e0);
          if (cVar7 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(Token \"",8);
            pcVar2 = ninja::Token::getKindName(&TStack_e0);
            if (pcVar2 == (char *)0x0) {
              std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x214928);
            }
            else {
              sVar3 = strlen(pcVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,sVar3)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," String:\"",9)
            ;
            str.Data = (char *)(ulong)TStack_e0.length;
            str.Length = sVar5;
            util::escapedString_abi_cxx11_(&sStack_c8,(util *)TStack_e0.start,str);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,sStack_c8._M_dataplus._M_p,
                                sStack_c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," Length:",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," Line:",6);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," Column:",8);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_c8._M_dataplus._M_p != &sStack_c8.field_2) {
              operator_delete(sStack_c8._M_dataplus._M_p,sStack_c8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        } while (TStack_e0.tokenKind != EndOfFile);
        ninja::Lexer::~Lexer(&LStack_a0);
        if (plStack_f0 != (long *)0x0) {
          (**(code **)(*plStack_f0 + 8))();
        }
        return 0;
      }
    }
    else {
      executeLexCommand();
    }
    __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/Error.h"
                  ,0x26c,
                  "storage_type *llvm::Expected<std::unique_ptr<llvm::MemoryBuffer>>::getStorage() [T = std::unique_ptr<llvm::MemoryBuffer>]"
                 );
  }
  cVar7 = '%';
  iVar1 = std::__cxx11::string::compare((char *)plVar8);
  if (iVar1 == 0) goto LAB_0011f08c;
  iVar1 = std::__cxx11::string::compare(*(char **)this);
  if (iVar1 == 0) {
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               *(long *)this + 0x20,*(undefined8 *)(this + 8));
    bVar6 = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare(*(char **)this);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare(*(char **)this);
      if (iVar1 == 0) {
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   *(long *)this + 0x20,*(undefined8 *)(this + 8));
        bVar6 = false;
      }
      else {
        iVar1 = std::__cxx11::string::compare(*(char **)this);
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare(*(char **)this);
          if (iVar1 == 0) {
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_48,*(long *)this + 0x20,*(undefined8 *)(this + 8));
            bVar6 = false;
          }
          else {
            iVar1 = std::__cxx11::string::compare(*(char **)this);
            if (iVar1 != 0) {
              iVar1 = std::__cxx11::string::compare(*(char **)this);
              if (iVar1 != 0) {
                executeNinjaCommand(this);
                return 1;
              }
              local_28 = 0;
              uStack_20 = 0;
              local_18 = 0;
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_28,*(long *)this + 0x20,*(undefined8 *)(this + 8));
              iVar1 = executeNinjaBuildCommand
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_28);
              this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        &local_28;
              goto LAB_0011f069;
            }
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_48.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_48,*(long *)this + 0x20,*(undefined8 *)(this + 8));
            bVar6 = true;
          }
          iVar1 = executeLoadManifestCommand(&local_48,bVar6);
          this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48;
          goto LAB_0011f069;
        }
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                   *(long *)this + 0x20,*(undefined8 *)(this + 8));
        bVar6 = true;
      }
      iVar1 = executeParseCommand(&local_48,bVar6);
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48;
      goto LAB_0011f069;
    }
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               *(long *)this + 0x20,*(undefined8 *)(this + 8));
    bVar6 = true;
  }
  iVar1 = executeLexCommand(&local_48,bVar6);
LAB_0011f069:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_00);
  return iVar1;
}

Assistant:

int commands::executeNinjaCommand(const std::vector<std::string>& args) {
  // Expect the first argument to be the name of another subtool to delegate to.
  if (args.empty() || args[0] == "--help")
    usage();

  if (args[0] == "lex") {
    return executeLexCommand(std::vector<std::string>(args.begin()+1,
                                                      args.end()),
                             /*LexOnly=*/false);
  } else if (args[0] == "lex-only") {
    return executeLexCommand(std::vector<std::string>(args.begin()+1,
                                                      args.end()),
                             /*LexOnly=*/true);
  } else if (args[0] == "parse") {
    return executeParseCommand(std::vector<std::string>(args.begin()+1,
                                                        args.end()),
                               /*ParseOnly=*/false);
  } else if (args[0] == "parse-only") {
    return executeParseCommand(std::vector<std::string>(args.begin()+1,
                                                        args.end()),
                               /*ParseOnly=*/true);
  } else if (args[0] == "load-manifest") {
    return executeLoadManifestCommand(std::vector<std::string>(args.begin()+1,
                                                               args.end()),
                                      /*LoadOnly=*/false);
  } else if (args[0] == "load-manifest-only") {
    return executeLoadManifestCommand(std::vector<std::string>(args.begin()+1,
                                                               args.end()),
                                      /*LoadOnly=*/true);
  } else if (args[0] == "build") {
    return executeNinjaBuildCommand(std::vector<std::string>(args.begin()+1,
                                                             args.end()));
  } else {
    fprintf(stderr, "error: %s: unknown command '%s'\n", getProgramName(),
            args[0].c_str());
    return 1;
  }
}